

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O0

ZyanStatus
ZydisFormatterTokenizeInstruction
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count,void *buffer,ZyanUSize length,
          ZyanU64 runtime_address,ZydisFormatterTokenConst **token,void *user_data)

{
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisFormatterContext context;
  ZydisFormatterToken *first_token;
  ZydisFormatterBuffer formatter_buffer;
  ZyanUSize length_local;
  void *buffer_local;
  ZyanU8 operand_count_local;
  ZydisDecodedOperand *operands_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisFormatter *formatter_local;
  
  if ((((formatter == (ZydisFormatter *)0x0) || (instruction == (ZydisDecodedInstruction *)0x0)) ||
      ((operand_count != '\0' && (operands == (ZydisDecodedOperand *)0x0)))) ||
     ((((10 < operand_count || (operand_count < instruction->operand_count_visible)) ||
       (buffer == (void *)0x0)) || ((length < 3 || (token == (ZydisFormatterTokenConst **)0x0))))))
  {
    formatter_local._4_4_ = 0x80100004;
  }
  else {
    formatter_buffer.string.vector.data = (void *)length;
    ZydisFormatterBufferInitTokenized
              ((ZydisFormatterBuffer *)&first_token,(ZydisFormatterToken **)&context.user_data,
               buffer,length);
    context.operand = (ZydisDecodedOperand *)runtime_address;
    context.operands = (ZydisDecodedOperand *)0x0;
    context.runtime_address = (ZyanU64)user_data;
    _status_047620348_1 = instruction;
    context.instruction = (ZydisDecodedInstruction *)operands;
    if (((formatter->func_pre_instruction == (ZydisFormatterFunc)0x0) ||
        (formatter_local._4_4_ =
              (*formatter->func_pre_instruction)
                        (formatter,(ZydisFormatterBuffer *)&first_token,
                         (ZydisFormatterContext *)&status_047620348_1),
        (formatter_local._4_4_ & 0x80000000) == 0)) &&
       ((formatter_local._4_4_ =
              (*formatter->func_format_instruction)
                        (formatter,(ZydisFormatterBuffer *)&first_token,
                         (ZydisFormatterContext *)&status_047620348_1),
        (formatter_local._4_4_ & 0x80000000) == 0 &&
        ((formatter->func_post_instruction == (ZydisFormatterFunc)0x0 ||
         (formatter_local._4_4_ =
               (*formatter->func_post_instruction)
                         (formatter,(ZydisFormatterBuffer *)&first_token,
                          (ZydisFormatterContext *)&status_047620348_1),
         (formatter_local._4_4_ & 0x80000000) == 0)))))) {
      if (*(char *)((long)context.user_data + 1) == '\0') {
        *token = (ZydisFormatterTokenConst *)context.user_data;
        formatter_local._4_4_ = 0x100000;
      }
      else {
        *token = (ZydisFormatterTokenConst *)
                 ((long)context.user_data +
                 (long)(int)(uint)*(byte *)((long)context.user_data + 1) + 2);
        formatter_local._4_4_ = 0x100000;
      }
    }
  }
  return formatter_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterTokenizeInstruction(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operands,
    ZyanU8 operand_count, void* buffer, ZyanUSize length, ZyanU64 runtime_address,
    ZydisFormatterTokenConst** token, void* user_data)
{
    if (!formatter || !instruction || (operand_count && !operands) ||
        (operand_count > ZYDIS_MAX_OPERAND_COUNT) || 
        (operand_count < instruction->operand_count_visible) || !buffer ||
        (length <= sizeof(ZydisFormatterToken)) || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterToken* first_token;
    ZydisFormatterBufferInitTokenized(&formatter_buffer, &first_token, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = operands;
    context.runtime_address = runtime_address;
    context.operand         = ZYAN_NULL;
    context.user_data       = user_data;

    if (formatter->func_pre_instruction)
    {
        ZYAN_CHECK(formatter->func_pre_instruction(formatter, &formatter_buffer, &context));
    }

    ZYAN_CHECK(formatter->func_format_instruction(formatter, &formatter_buffer, &context));

    if (formatter->func_post_instruction)
    {
        ZYAN_CHECK(formatter->func_post_instruction(formatter, &formatter_buffer, &context));
    }

    if (first_token->next)
    {
        *token = (ZydisFormatterTokenConst*)((ZyanU8*)first_token + sizeof(ZydisFormatterToken) +
            first_token->next);
        return ZYAN_STATUS_SUCCESS;
    }

    *token = first_token;
    return ZYAN_STATUS_SUCCESS;
}